

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_request.hpp
# Opt level: O0

void __thiscall
foxxll::linuxaio_request::linuxaio_request
          (linuxaio_request *this,completion_handler *on_complete,file *file,void *buffer,
          offset_type offset,size_type bytes,read_or_write *op)

{
  long local_60;
  size_type bytes_local;
  offset_type offset_local;
  void *buffer_local;
  file *file_local;
  completion_handler *on_complete_local;
  linuxaio_request *this_local;
  
  request_interface::request_interface((request_interface *)this);
  request_with_state::request_with_state
            (&this->super_request_with_state,&PTR_PTR_001e6078,on_complete,file,buffer,offset,bytes,
             *op);
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR_add_waiter_001e6018;
  *(undefined ***)&(this->super_request_with_state).super_request_with_waiters.super_request =
       &PTR_add_waiter_001e6018;
  if (file == (file *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(file,&foxxll::file::typeinfo,&linuxaio_file::typeinfo,
                              0xffffffffffffffff);
  }
  if (local_60 != 0) {
    return;
  }
  __assert_fail("dynamic_cast<linuxaio_file*>(file)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/io/linuxaio_request.hpp"
                ,0x36,
                "foxxll::linuxaio_request::linuxaio_request(const completion_handler &, file *, void *, offset_type, size_type, const read_or_write &)"
               );
}

Assistant:

linuxaio_request(
        const completion_handler& on_complete,
        file* file, void* buffer, offset_type offset, size_type bytes,
        const read_or_write& op)
        : request_with_state(on_complete, file, buffer, offset, bytes, op)
    {
        assert(dynamic_cast<linuxaio_file*>(file));
        TLX_LOG << "linuxaio_request[" << this << "]"
                << " linuxaio_request"
                << "(file=" << file << " buffer=" << buffer
                << " offset=" << offset << " bytes=" << bytes
                << " op=" << op << ")";
    }